

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_childUnitsWithIllegalPrefix_Test::Units_childUnitsWithIllegalPrefix_Test
          (Units_childUnitsWithIllegalPrefix_Test *this)

{
  Units_childUnitsWithIllegalPrefix_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Units_childUnitsWithIllegalPrefix_Test_001b57c8;
  return;
}

Assistant:

TEST(Units, childUnitsWithIllegalPrefix)
{
    auto model = libcellml::Model::create("model");

    auto u1 = libcellml::Units::create("u1");
    auto u2 = libcellml::Units::create("u2");
    auto u3 = libcellml::Units::create("u3");
    auto u4 = libcellml::Units::create("u4");
    auto u5 = libcellml::Units::create("u5");

    model->addUnits(u1);
    model->addUnits(u2);
    model->addUnits(u3);
    model->addUnits(u4);
    model->addUnits(u5);

    u5->addUnit("u4");
    u4->addUnit("u3");
    u3->addUnit("u2", "notAPrefix");
    u2->addUnit("second");
    u1->addUnit("second", "milli");

    auto scaling = libcellml::Units::scalingFactor(u1, u5);
    EXPECT_EQ(0.0, scaling);
}